

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<12,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Type in0;
  float afStack_c8 [2];
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_b0;
  int local_a8 [4];
  float local_98 [4];
  float local_88 [4];
  Matrix<float,_4,_2> local_78;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_3c;
  undefined4 local_34;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_1c;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_78.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_78.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    local_78.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_78.m_data.m_data[1].m_data[3] = evalCtx->in[1].m_data[3];
  }
  else {
    local_78.m_data.m_data[0].m_data[0] = -0.6;
    local_78.m_data.m_data[0].m_data[1] = -0.6;
    local_78.m_data.m_data[0].m_data[2] = -0.2;
    local_78.m_data.m_data[0].m_data[3] = -0.1;
    local_78.m_data.m_data[1].m_data[0] = -1.1;
    local_78.m_data.m_data[1].m_data[1] = -0.6;
    local_78.m_data.m_data[1].m_data[2] = -0.6;
    local_78.m_data.m_data[1].m_data[3] = -0.1;
  }
  decrement<float,4,2>(&local_78);
  local_50 = local_30;
  local_48 = local_28;
  local_b0 = local_1c;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  lVar1 = 0;
  do {
    local_88[lVar1] =
         *(float *)((long)&local_50 + lVar1 * 4) + *(float *)((long)&local_b0 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  decrement<float,4,2>(&local_78);
  local_b0 = local_50;
  local_a8[0] = local_48;
  local_c0 = local_3c;
  local_b8 = local_34;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  lVar1 = 0;
  do {
    local_98[lVar1] =
         *(float *)((long)&local_b0 + lVar1 * 4) + *(float *)((long)&local_c0 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_c0 = 0;
  local_b8 = 0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_c0 + lVar1 * 4) = local_88[lVar1] + local_98[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_a8[0] = 0;
  local_a8[1] = 1;
  local_a8[2] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_b0 + lVar1 * 4)] = afStack_c8[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}